

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O0

Aig_Obj_t ** Aig_ManStaticFanoutStart(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t **ppAVar4;
  void *pvVar5;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar6;
  int local_28;
  int nFanoutsAlloc;
  int nFanouts;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppFanouts;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  iVar2 = Aig_ManCiNum(p);
  iVar3 = Aig_ManCoNum(p);
  iVar3 = (iVar1 * 2 - iVar2) - iVar3;
  ppAVar4 = (Aig_Obj_t **)malloc((long)iVar3 << 3);
  local_28 = 0;
  for (nFanoutsAlloc = 0; iVar1 = Vec_PtrSize(p->vObjs), nFanoutsAlloc < iVar1;
      nFanoutsAlloc = nFanoutsAlloc + 1) {
    pvVar5 = Vec_PtrEntry(p->vObjs,nFanoutsAlloc);
    if (pvVar5 != (void *)0x0) {
      *(Aig_Obj_t ***)((long)pvVar5 + 0x28) = ppAVar4 + local_28;
      local_28 = ((uint)(*(ulong *)((long)pvVar5 + 0x18) >> 6) & 0x3ffffff) + local_28;
      *(ulong *)((long)pvVar5 + 0x18) = *(ulong *)((long)pvVar5 + 0x18) & 0xffffffff0000003f;
    }
  }
  if (local_28 < iVar3) {
    for (nFanoutsAlloc = 0; iVar1 = Vec_PtrSize(p->vObjs), nFanoutsAlloc < iVar1;
        nFanoutsAlloc = nFanoutsAlloc + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,nFanoutsAlloc);
      if (pObj_00 != (Aig_Obj_t *)0x0) {
        pAVar6 = Aig_ObjChild0(pObj_00);
        if (pAVar6 != (Aig_Obj_t *)0x0) {
          pAVar6 = Aig_ObjFanin0(pObj_00);
          Aig_ObjSetFanoutStatic(pAVar6,pObj_00);
        }
        pAVar6 = Aig_ObjChild1(pObj_00);
        if (pAVar6 != (Aig_Obj_t *)0x0) {
          pAVar6 = Aig_ObjFanin1(pObj_00);
          Aig_ObjSetFanoutStatic(pAVar6,pObj_00);
        }
      }
    }
    return ppAVar4;
  }
  __assert_fail("nFanouts < nFanoutsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetFwd.c"
                ,0x42,"Aig_Obj_t **Aig_ManStaticFanoutStart(Aig_Man_t *)");
}

Assistant:

Aig_Obj_t ** Aig_ManStaticFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t ** ppFanouts, * pObj;
    int i, nFanouts, nFanoutsAlloc;
    // allocate fanouts
    nFanoutsAlloc = 2 * Aig_ManObjNumMax(p) - Aig_ManCiNum(p) - Aig_ManCoNum(p);
    ppFanouts = ABC_ALLOC( Aig_Obj_t *, nFanoutsAlloc );
    // mark up storage
    nFanouts = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->pData = ppFanouts + nFanouts;
        nFanouts += pObj->nRefs;  
        pObj->nRefs = 0;
    }
    assert( nFanouts < nFanoutsAlloc ); 
    // add fanouts
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin1(pObj), pObj );
    }
    return ppFanouts;
}